

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_tools.cpp
# Opt level: O3

void __thiscall dlib::tt::tensor_rand::fill_uniform(tensor_rand *this,tensor *data)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  float *x;
  float fVar5;
  float *pfVar4;
  
  iVar2 = (*data->_vptr_tensor[3])(data);
  iVar3 = (*data->_vptr_tensor[3])(data);
  lVar1 = data->m_size;
  for (pfVar4 = (float *)CONCAT44(extraout_var,iVar2);
      pfVar4 != (float *)(CONCAT44(extraout_var_00,iVar3) + lVar1 * 4); pfVar4 = pfVar4 + 1) {
    fVar5 = rand::get_random_float(&this->rnd);
    *pfVar4 = fVar5;
  }
  return;
}

Assistant:

void tensor_rand::
    fill_uniform (
        tensor& data
    )
    {
#ifdef DLIB_USE_CUDA
        rnd.fill_uniform(data);
#else
        for (auto& x : data) 
            x = rnd.get_random_float();
#endif
    }